

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

void __thiscall
dxil_spv::SPIRVModule::Impl::register_builtin_shader_input(Impl *this,Id id,BuiltIn builtin)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  mapped_type local_28;
  Id local_24;
  
  _local_28 = CONCAT44(id,builtin);
  pmVar2 = std::__detail::
           _Map_base<spv::BuiltIn,_std::pair<const_spv::BuiltIn,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spv::BuiltIn,_std::pair<const_spv::BuiltIn,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtins_input,&local_28);
  *pmVar2 = id;
  mVar1 = local_28;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->id_to_builtin_input,&local_24);
  *pmVar3 = mVar1;
  return;
}

Assistant:

void SPIRVModule::Impl::register_builtin_shader_input(spv::Id id, spv::BuiltIn builtin)
{
	builtins_input[builtin] = id;
	id_to_builtin_input[id] = builtin;
}